

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

DescriptiveFramework * __thiscall
ASDCP::MXF::DescriptiveFramework::InitFromTLVSet(DescriptiveFramework *this,TLVReader *TLVSet)

{
  MDDEntry *Object;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_DescriptiveFramework_LinkedDescriptiveFrameworkPlugInId);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)Object);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)&TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket ==
           Kumu::RESULT_OK;
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xbe1,
                "virtual ASDCP::Result_t ASDCP::MXF::DescriptiveFramework::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
DescriptiveFramework::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(DescriptiveFramework, LinkedDescriptiveFrameworkPlugInId));
    LinkedDescriptiveFrameworkPlugInId.set_has_value( result == RESULT_OK );
  }
  return result;
}